

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O1

void __thiscall
deci::ast_postfix_t::ast_postfix_t(ast_postfix_t *this,string *identifier,ast_arg_list_t *arglist)

{
  pointer pcVar1;
  
  (this->super_ast_item_t).parent = (ast_item_t *)0x0;
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011e4e0;
  this->arglist = arglist;
  (this->identifier)._M_dataplus._M_p = (pointer)&(this->identifier).field_2;
  pcVar1 = (identifier->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->identifier,pcVar1,pcVar1 + identifier->_M_string_length);
  return;
}

Assistant:

ast_postfix_t::ast_postfix_t(const std::string& identifier, ast_arg_list_t* arglist)
    :arglist(arglist), identifier(identifier) {
      ;
  }